

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::peer_connection::second_tick(peer_connection *this,int tick_interval_ms)

{
  session_interface *psVar1;
  bool bVar2;
  piece_index_t new_piece;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  element_type *peVar7;
  alert_manager *paVar8;
  element_type *peVar9;
  value_type *pvVar10;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *ptVar11;
  ulong uVar12;
  size_type sVar13;
  ulong uVar14;
  bool local_56d;
  bool local_509;
  bool local_4d1;
  bool local_4c5;
  bool local_481;
  bool local_44a;
  bool local_419;
  bool local_3e8;
  bool local_3bc;
  bool local_3a9;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_338;
  rep local_330;
  duration<long,_std::ratio<1L,_1L>_> local_328;
  duration local_320;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_318;
  duration<long,_std::ratio<1L,_1000000000L>_> local_310;
  int local_308 [2];
  int piece_timeout;
  int local_2ec;
  duration<long,_std::ratio<1L,_1L>_> local_2e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2e0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_2d8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_2d0;
  undefined1 local_2c1;
  error_code local_2c0;
  rep local_2b0;
  unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_> local_2a8
  ;
  error_code local_2a0;
  bool local_28e;
  byte local_28d;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_28c;
  bool max_torrent_conns;
  bool max_session_conns;
  duration<long,_std::ratio<1L,_1000000000L>_> local_280;
  time_duration time_limit;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_270;
  duration<long,_std::ratio<1L,_1000000000L>_> local_268;
  time_duration d2;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_258;
  time_point local_250;
  time_duration d1;
  error_code local_240;
  rep local_230;
  error_code local_228;
  int local_214;
  duration<long,_std::ratio<1L,_1L>_> local_210;
  duration local_208;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_200;
  duration local_1f8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1f0;
  duration local_1e8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1e0;
  service_type *local_1d8;
  undefined1 local_1c9;
  error_code local_1c8;
  wait_op *local_1b8;
  duration<long,_std::ratio<1L,_1L>_> local_1b0;
  int local_1a8;
  undefined1 local_1a1;
  int timeout;
  undefined8 local_190;
  error_code local_188;
  int local_174;
  duration<long,_std::ratio<1L,_1L>_> local_170;
  uchar local_164;
  uchar local_163;
  bitfield_flag local_162;
  byte local_161;
  undefined1 local_160 [7];
  bool reading_socket;
  wait_op *local_150;
  error_code local_148;
  duration<long,_std::ratio<1L,_1L>_> local_138;
  int local_12c;
  undefined1 auStack_128 [4];
  int connect_timeout;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_120;
  duration<long,_std::ratio<1L,_1000000000L>_> local_118;
  time_duration d;
  shared_ptr<libtorrent::peer_plugin> *e;
  iterator __end2;
  iterator __begin2;
  list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
  *__range2;
  piece_index_t local_e8;
  int local_e4;
  duration<long,_std::ratio<1L,_1L>_> local_e0;
  duration local_d8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_d0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  duration local_b8;
  duration local_b0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_a8;
  int local_9c;
  duration<long,_std::ratio<1L,_1L>_> local_98;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_90;
  undefined4 local_88;
  undefined1 local_81;
  error_code local_80;
  performance_warning_t local_6c;
  undefined1 local_68 [24];
  int channel;
  byte local_41;
  undefined1 local_40 [7];
  uint8_t warning;
  shared_ptr<libtorrent::aux::torrent> t;
  shared_ptr<libtorrent::aux::peer_connection> me;
  time_point now;
  int tick_interval_ms_local;
  peer_connection *this_local;
  
  me.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)time_now();
  self((peer_connection *)
       &t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_40);
  local_41 = 0;
  bVar2 = session_settings::get_bool((this->super_peer_connection_hot_members).m_settings,0x8010);
  if ((bVar2) &&
     (bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40), bVar2)) {
    psVar1 = (this->super_peer_connection_hot_members).m_ses;
    uVar3 = stat::download_ip_overhead(&this->m_statistics);
    uVar6 = stat::upload_ip_overhead(&this->m_statistics);
    iVar4 = (*(psVar1->super_session_logger)._vptr_session_logger[0x35])
                      (psVar1,&(this->super_peer_connection_hot_members).field_0x2c,(ulong)uVar3,
                       (ulong)uVar6);
    local_41 = local_41 | (byte)iVar4;
    psVar1 = (this->super_peer_connection_hot_members).m_ses;
    peVar7 = ::std::
             __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_40);
    uVar3 = stat::download_ip_overhead(&this->m_statistics);
    uVar6 = stat::upload_ip_overhead(&this->m_statistics);
    iVar4 = (*(psVar1->super_session_logger)._vptr_session_logger[0x35])
                      (psVar1,&peVar7->super_peer_class_set,(ulong)uVar3,(ulong)uVar6);
    local_41 = local_41 | (byte)iVar4;
  }
  if (local_41 != 0) {
    peVar7 = ::std::
             __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
    paVar8 = torrent::alerts(peVar7);
    bVar2 = alert_manager::should_post<libtorrent::performance_alert>(paVar8);
    if (bVar2) {
      for (local_68._16_4_ = 0; (int)local_68._16_4_ < 2; local_68._16_4_ = local_68._16_4_ + 1) {
        if (((int)(uint)local_41 >> ((byte)local_68._16_4_ & 0x1f) & 1U) != 0) {
          peVar7 = ::std::
                   __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_40);
          paVar8 = torrent::alerts(peVar7);
          ::std::
          __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_40);
          torrent::get_handle((torrent *)local_68);
          local_6c = local_68._16_4_ == 1 | upload_limit_too_low;
          alert_manager::
          emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
                    (paVar8,(torrent_handle *)local_68,&local_6c);
          torrent_handle::~torrent_handle((torrent_handle *)local_68);
        }
      }
    }
  }
  bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
  if ((bVar2) && (((this->super_peer_connection_hot_members).field_0x28 & 1) == 0)) {
    local_3a9 = false;
    if ((((byte)(this->super_peer_connection_hot_members).field_0x28 >> 2 & 1) != 0) &&
       (local_3a9 = false,
       ((byte)(this->super_peer_connection_hot_members).field_0x28 >> 4 & 1) != 0)) {
      bVar2 = ::std::
              vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
              ::empty(&(this->m_download_queue).
                       super_vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                     );
      local_3a9 = false;
      if (bVar2) {
        bVar2 = ::std::
                vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                ::empty(&this->m_request_queue);
        local_3a9 = false;
        if (bVar2) {
          local_9c = 5;
          ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                    ((duration<long,std::ratio<1l,1l>> *)&local_98,&local_9c);
          local_90 = ::std::chrono::operator-
                               ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 *)&me.
                                    super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,&local_98);
          local_b0.__r = (this->m_connect).__d.__r;
          local_a8.__d.__r =
               (duration)relative_time::get(&this->m_last_request,(time_point)local_b0.__r);
          local_3a9 = ::std::chrono::operator>=(&local_90,&local_a8);
        }
      }
    }
    if (local_3a9 != false) {
      local_b8.__r = (this->m_connect).__d.__r;
      local_c0 = me.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
      relative_time::set(&this->m_last_request,(time_point)local_b8.__r,
                         (time_point)
                         me.
                         super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
      peVar7 = ::std::
               __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_40);
      bVar2 = request_a_block(peVar7,this);
      if (bVar2) {
        counters::inc_stats_counter(this->m_counters,0x1f,1);
      }
      if (((this->super_peer_connection_hot_members).field_0x28 & 1) != 0) {
        local_88 = 1;
        goto LAB_00452b42;
      }
      send_block_requests(this);
    }
    peVar7 = ::std::
             __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
    bVar2 = torrent::super_seeding(peVar7);
    local_3bc = false;
    if (bVar2) {
      peVar7 = ::std::
               __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
      bVar2 = torrent::ready_for_connections(peVar7);
      local_3bc = false;
      if ((bVar2) && (local_3bc = false, ((byte)this->field_0x887 >> 1 & 1) == 0)) {
        local_d8.__r = (this->m_connect).__d.__r;
        local_d0.__d.__r =
             (duration)relative_time::get(&this->m_became_uninterested,(time_point)local_d8.__r);
        local_e4 = 10;
        ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1l>> *)&local_e0,&local_e4);
        local_c8 = ::std::chrono::operator+(&local_d0,&local_e0);
        local_3bc = ::std::chrono::operator<
                              (&local_c8,
                               (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&me.
                                   super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
      }
    }
    if (local_3bc != false) {
      strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_e8,-1);
      peVar7 = ::std::
               __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
      new_piece = torrent::get_piece_to_super_seed
                            (peVar7,&(this->super_peer_connection_hot_members).m_have_piece);
      superseed_piece(this,local_e8,new_piece);
    }
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2f])();
    uVar3 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
    if ((uVar3 & 1) == 0) {
      __end2 = ::std::__cxx11::
               list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
               ::begin(&this->m_extensions);
      e = (shared_ptr<libtorrent::peer_plugin> *)
          ::std::__cxx11::
          list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
          ::end(&this->m_extensions);
      while (bVar2 = ::std::operator!=(&__end2,(_Self *)&e), bVar2) {
        d.__r = (rep)::std::_List_iterator<std::shared_ptr<libtorrent::peer_plugin>_>::operator*
                               (&__end2);
        peVar9 = ::std::
                 __shared_ptr_access<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)d.__r);
        (*peVar9->_vptr_peer_plugin[0x2a])();
        ::std::_List_iterator<std::shared_ptr<libtorrent::peer_plugin>_>::operator++(&__end2);
      }
      uVar3 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
      if ((uVar3 & 1) == 0) {
        _auStack_128 = (this->m_connect).__d.__r;
        local_120.__d.__r =
             (duration)relative_time::get(&this->m_last_receive,(time_point)_auStack_128);
        local_118.__r =
             (rep)::std::chrono::operator-
                            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)&me.
                                 super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount,&local_120);
        if (((byte)(this->super_peer_connection_hot_members).field_0x28 >> 1 & 1) != 0) {
          local_12c = session_settings::get_int
                                ((this->super_peer_connection_hot_members).m_settings,0x4011);
          if (this->m_peer_info != (torrent_peer *)0x0) {
            local_12c = (*(uint *)&this->m_peer_info->field_0x1b & 0x1f) * 3 + local_12c;
          }
          bVar2 = is_ssl(&this->m_socket);
          if (bVar2) {
            local_12c = local_12c + 10;
          }
          bVar2 = is_i2p(&this->m_socket);
          if (bVar2) {
            local_12c = local_12c + 0x14;
          }
          ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                    ((duration<long,std::ratio<1l,1l>> *)&local_138,&local_12c);
          bVar2 = ::std::chrono::operator>(&local_118,&local_138);
          local_3e8 = false;
          if (bVar2) {
            boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                      (&local_148,timed_out,(type *)0x0);
            local_3e8 = can_disconnect(this,&local_148);
          }
          if (local_3e8 != false) {
            local_150 = (wait_op *)local_118.__r;
            uVar14 = total_seconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                               (local_118);
            peer_log(this,info,"CONNECT_FAILED","waited %d seconds",uVar14 & 0xffffffff);
            boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                      ((error_code *)local_160,timed_out,(type *)0x0);
            connect_failed(this,(error_code *)local_160);
            local_88 = 1;
            goto LAB_00452b42;
          }
        }
        pvVar10 = container_wrapper<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>,_long,_std::array<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>,_2UL>_>
                  ::operator[](&this->m_channel_state,1);
        local_163 = pvVar10->m_val;
        local_164 = '\x04';
        local_162 = (bitfield_flag)
                    libtorrent::flags::operator&
                              ((bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>
                                )local_163,
                               (bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>
                                )'\x04');
        local_161 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_162);
        local_419 = false;
        if ((bool)local_161) {
          local_174 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x33])();
          ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                    ((duration<long,std::ratio<1l,1l>> *)&local_170,&local_174);
          bVar2 = ::std::chrono::operator>(&local_118,&local_170);
          local_419 = false;
          if (((bVar2) &&
              (local_419 = false,
              ((byte)(this->super_peer_connection_hot_members).field_0x28 >> 1 & 1) == 0)) &&
             (local_419 = false, this->m_reading_bytes == 0)) {
            boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                      (&local_188,timed_out_inactivity,(type *)0x0);
            local_419 = can_disconnect(this,&local_188);
          }
        }
        if (local_419 == false) {
          local_1a8 = session_settings::get_int
                                ((this->super_peer_connection_hot_members).m_settings,0x401b);
          bVar2 = is_i2p(&this->m_socket);
          iVar4 = 1;
          if (bVar2) {
            iVar4 = 4;
          }
          local_1a8 = iVar4 * local_1a8;
          local_44a = false;
          if (((local_161 & 1) != 0) &&
             (local_44a = false,
             ((byte)(this->super_peer_connection_hot_members).field_0x28 >> 1 & 1) == 0)) {
            uVar3 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x1b])();
            local_44a = false;
            if ((uVar3 & 1) != 0) {
              ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                        ((duration<long,std::ratio<1l,1l>> *)&local_1b0,&local_1a8);
              local_44a = ::std::chrono::operator>(&local_118,&local_1b0);
            }
          }
          if (local_44a == false) {
            local_1e8.__r = (this->m_connect).__d.__r;
            local_1e0.__d.__r =
                 (duration)relative_time::get(&this->m_last_unchoke,(time_point)local_1e8.__r);
            local_1f8.__r = (this->m_connect).__d.__r;
            local_1f0.__d.__r =
                 (duration)
                 relative_time::get(&this->m_last_incoming_request,(time_point)local_1f8.__r);
            ptVar11 = ::std::
                      max<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                                (&local_1e0,&local_1f0);
            local_208.__r = (this->m_connect).__d.__r;
            local_200.__d.__r =
                 (duration)relative_time::get(&this->m_last_sent_payload,(time_point)local_208.__r);
            ptVar11 = ::std::
                      max<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                                (ptVar11,&local_200);
            local_1d8 = (service_type *)
                        ::std::chrono::operator-
                                  ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)&me.
                                       super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount,ptVar11);
            local_481 = false;
            local_118.__r = (rep)local_1d8;
            if (((local_161 & 1) != 0) &&
               (local_481 = false,
               ((byte)(this->super_peer_connection_hot_members).field_0x28 >> 1 & 1) == 0)) {
              bVar2 = ::std::
                      vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>::
                      empty(&(this->m_requests).
                             super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                           );
              local_481 = false;
              if ((bVar2) &&
                 (((local_481 = false, this->m_reading_bytes == 0 &&
                   (local_481 = false,
                   ((byte)(this->super_peer_connection_hot_members).field_0x28 >> 5 & 1) == 0)) &&
                  (local_481 = false, ((byte)this->field_0x887 >> 1 & 1) != 0)))) {
                bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
                local_481 = false;
                if (bVar2) {
                  peVar7 = ::std::
                           __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_40);
                  bVar2 = torrent::is_upload_only(peVar7);
                  local_481 = false;
                  if (bVar2) {
                    local_214 = 0x3c;
                    ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                              ((duration<long,std::ratio<1l,1l>> *)&local_210,&local_214);
                    bVar2 = ::std::chrono::operator>(&local_118,&local_210);
                    local_481 = false;
                    if (bVar2) {
                      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                                (&local_228,timed_out_no_request,(type *)0x0);
                      local_481 = can_disconnect(this,&local_228);
                    }
                  }
                }
              }
            }
            if (local_481 == false) {
              d2.__r = (this->m_connect).__d.__r;
              local_258._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   relative_time::get(&this->m_became_uninterested,(time_point)d2.__r);
              local_250.__d.__r =
                   ::std::chrono::operator-
                             ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)&me.
                                  super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount,
                              (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)&local_258);
              time_limit.__r = (this->m_connect).__d.__r;
              local_270.__d.__r =
                   (duration)
                   relative_time::get(&this->m_became_uninteresting,(time_point)time_limit.__r);
              local_268.__r =
                   (rep)::std::chrono::operator-
                                  ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)&me.
                                       super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount,&local_270);
              local_28c.m_val =
                   session_settings::get_int
                             ((this->super_peer_connection_hot_members).m_settings,0x4013);
              ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                        ((duration<long,std::ratio<1l,1l>> *)&stack0xfffffffffffffd78,
                         (int *)&local_28c);
              ::std::chrono::duration<long,std::ratio<1l,1000000000l>>::
              duration<long,std::ratio<1l,1l>,void>
                        ((duration<long,std::ratio<1l,1000000000l>> *)&local_280,
                         (duration<long,_std::ratio<1L,_1L>_> *)&stack0xfffffffffffffd78);
              iVar4 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
                        _vptr_session_logger[0x1e])();
              iVar5 = session_settings::get_int
                                ((this->super_peer_connection_hot_members).m_settings,0x4055);
              local_28d = iVar5 + -5 <= iVar4;
              bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
              local_4c5 = false;
              if (bVar2) {
                peVar7 = ::std::
                         __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_40);
                iVar4 = torrent::num_peers(peVar7);
                peVar7 = ::std::
                         __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_40);
                iVar5 = torrent::max_connections(peVar7);
                local_4c5 = iVar5 + -5 <= iVar4;
              }
              local_28e = local_4c5;
              local_4d1 = false;
              if ((((local_161 & 1) != 0) &&
                  (local_4d1 = false,
                  ((byte)(this->super_peer_connection_hot_members).field_0x28 >> 4 & 1) == 0)) &&
                 (local_4d1 = false, ((byte)this->field_0x887 >> 1 & 1) == 0)) {
                bVar2 = ::std::chrono::operator>(&local_250.__d,&local_280);
                local_4d1 = false;
                if (bVar2) {
                  bVar2 = ::std::chrono::operator>(&local_268,&local_280);
                  local_4d1 = false;
                  if ((bVar2) &&
                     (((local_28d & 1) != 0 || (local_4d1 = false, (local_28e & 1U) != 0)))) {
                    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                              (&local_2a0,timed_out_no_interest,(type *)0x0);
                    local_4d1 = can_disconnect(this,&local_2a0);
                  }
                }
              }
              if (local_4d1 == false) {
                local_509 = false;
                if ((local_161 & 1) != 0) {
                  bVar2 = ::std::
                          vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                          ::empty(&(this->m_download_queue).
                                   super_vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                                 );
                  local_509 = false;
                  if ((!bVar2) && (local_509 = false, 0 < this->m_quota[1])) {
                    local_2e0._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->m_connect).__d.__r;
                    local_2d8.__d.__r =
                         (duration)
                         relative_time::get(&this->m_requested,(time_point)local_2e0._M_pi);
                    local_2ec = request_timeout(this);
                    ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                              ((duration<long,std::ratio<1l,1l>> *)&local_2e8,&local_2ec);
                    local_2d0 = ::std::chrono::operator+(&local_2d8,&local_2e8);
                    local_509 = ::std::chrono::operator>
                                          ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                            *)&me.
                                               super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount,&local_2d0);
                  }
                }
                if (local_509 != false) {
                  snub_peer(this);
                }
                keep_alive(this);
                if ((((((byte)this->field_0x887 >> 5 & 1) != 0) &&
                     (-1 < *(short *)&this->field_0x885)) && (0 < this->m_downloaded_last_second))
                   && (iVar4 = this->m_downloaded_last_second,
                      iVar5 = stat::last_payload_downloaded(&this->m_statistics),
                      iVar5 <= iVar4 + 5000)) {
                  this->field_0x887 = this->field_0x887 & 0xdf;
                  bVar2 = should_log(this,info);
                  if (bVar2) {
                    uVar3 = this->m_downloaded_last_second;
                    uVar6 = stat::last_payload_downloaded(&this->m_statistics);
                    peer_log(this,info,"SLOW_START","exit slow start: prev-dl: %d dl: %d",
                             (ulong)uVar3,(ulong)uVar6);
                  }
                }
                iVar4 = stat::last_payload_downloaded(&this->m_statistics);
                this->m_downloaded_last_second = iVar4;
                iVar4 = stat::last_payload_uploaded(&this->m_statistics);
                this->m_uploaded_last_second = iVar4;
                stat::second_tick(&this->m_statistics,tick_interval_ms);
                iVar4 = stat::upload_payload_rate(&this->m_statistics);
                if (this->m_upload_rate_peak < iVar4) {
                  iVar4 = stat::upload_payload_rate(&this->m_statistics);
                  this->m_upload_rate_peak = iVar4;
                }
                iVar4 = stat::download_payload_rate(&this->m_statistics);
                if (this->m_download_rate_peak < iVar4) {
                  iVar4 = stat::download_payload_rate(&this->m_statistics);
                  this->m_download_rate_peak = iVar4;
                }
                uVar3 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
                if ((uVar3 & 1) == 0) {
                  peVar7 = ::std::
                           __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_40);
                  bVar2 = torrent::ready_for_connections(peVar7);
                  if (bVar2) {
                    update_desired_queue_size(this);
                    if (this->m_desired_queue_size == this->m_max_out_request_queue) {
                      peVar7 = ::std::
                               __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)local_40);
                      paVar8 = torrent::alerts(peVar7);
                      bVar2 = alert_manager::should_post<libtorrent::performance_alert>(paVar8);
                      if (bVar2) {
                        peVar7 = ::std::
                                 __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                               *)local_40);
                        paVar8 = torrent::alerts(peVar7);
                        ::std::
                        __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_40);
                        torrent::get_handle((torrent *)&piece_timeout);
                        local_308[1] = 1;
                        alert_manager::
                        emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
                                  (paVar8,(torrent_handle *)&piece_timeout,
                                   (performance_warning_t *)(local_308 + 1));
                        torrent_handle::~torrent_handle((torrent_handle *)&piece_timeout);
                      }
                    }
                    local_308[0] = session_settings::get_int
                                             ((this->super_peer_connection_hot_members).m_settings,
                                              0x4004);
                    bVar2 = ::std::
                            vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                            ::empty(&(this->m_download_queue).
                                     super_vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                                   );
                    local_56d = false;
                    if ((!bVar2) && (local_56d = false, 0 < this->m_quota[1])) {
                      local_320.__r = (this->m_connect).__d.__r;
                      local_318.__d.__r =
                           (duration)
                           relative_time::get(&this->m_last_piece,(time_point)local_320.__r);
                      local_310.__r =
                           (rep)::std::chrono::operator-
                                          ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                            *)&me.
                                               super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount,&local_318);
                      ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                                ((duration<long,std::ratio<1l,1l>> *)&local_328,local_308);
                      local_56d = ::std::chrono::operator>(&local_310,&local_328);
                    }
                    if (local_56d != false) {
                      bVar2 = should_log(this,info);
                      if (bVar2) {
                        sVar13 = ::std::
                                 vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                                 ::size(&(this->m_download_queue).
                                         super_vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                                       );
                        local_338.__d.__r =
                             (duration)
                             relative_time::get(&this->m_last_piece,
                                                (time_point)(this->m_connect).__d.__r);
                        local_330 = (rep)::std::chrono::operator-
                                                   ((
                                                  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                                  *)&me.
                                                  super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount,&local_338);
                        uVar14 = total_seconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                                           ((duration<long,_std::ratio<1L,_1000000000L>_>)local_330)
                        ;
                        peer_log(this,info,"PIECE_REQUEST_TIMED_OUT","%d time: %d to: %d",
                                 sVar13 & 0xffffffff,uVar14 & 0xffffffff,local_308[0]);
                      }
                      snub_peer(this);
                    }
                    fill_send_buffer(this);
                    local_88 = 0;
                  }
                  else {
                    local_88 = 1;
                  }
                }
                else {
                  local_88 = 1;
                }
              }
              else {
                bVar2 = should_log(this,info);
                if (bVar2) {
                  local_2a8._M_t.
                  super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                  .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl =
                       (__uniq_ptr_data<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>,_true,_true>
                        )(__uniq_ptr_data<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>,_true,_true>
                          )local_250.__d.__r;
                  uVar14 = total_seconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                                     (local_250.__d.__r);
                  local_2b0 = local_268.__r;
                  uVar12 = total_seconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                                     (local_268);
                  peer_log(this,info,"MUTUAL_NO_INTEREST","t1: %d t2: %d",uVar14 & 0xffffffff,
                           uVar12 & 0xffffffff);
                }
                boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                          (&local_2c0,timed_out_no_interest,(type *)0x0);
                local_2c1 = 0;
                (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,&local_2c0,1,0);
                local_88 = 1;
              }
            }
            else {
              local_230 = local_118.__r;
              uVar14 = total_seconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                                 (local_118);
              peer_log(this,info,"NO_REQUEST","waited %d seconds",uVar14 & 0xffffffff);
              boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                        (&local_240,timed_out_no_request,(type *)0x0);
              d1.__r._7_1_ = 0;
              (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,&local_240,1,0);
              local_88 = 1;
            }
          }
          else {
            local_1b8 = (wait_op *)local_118.__r;
            uVar14 = total_seconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                               (local_118);
            peer_log(this,info,"NO_HANDSHAKE","waited %d seconds",uVar14 & 0xffffffff);
            boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                      (&local_1c8,timed_out_no_handshake,(type *)0x0);
            local_1c9 = 0;
            (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,&local_1c8,1,0);
            local_88 = 1;
          }
        }
        else {
          local_190 = local_118.__r;
          uVar14 = total_seconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>(local_118);
          peer_log(this,info,"LAST_ACTIVITY","%d seconds ago",uVar14 & 0xffffffff);
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    ((error_code *)&timeout,timed_out_inactivity,(type *)0x0);
          local_1a1 = 0;
          (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                    (this,(error_code *)&timeout,1,0);
          local_88 = 1;
        }
      }
      else {
        local_88 = 1;
      }
    }
    else {
      local_88 = 1;
    }
  }
  else {
    if (((byte)(this->super_peer_connection_hot_members).field_0x28 >> 1 & 1) != 0) {
      counters::inc_stats_counter(this->m_counters,0xe5,-1);
      bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
      if (bVar2) {
        peVar7 = ::std::
                 __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_40);
        torrent::dec_num_connecting(peVar7,this->m_peer_info);
      }
      (this->super_peer_connection_hot_members).field_0x28 =
           (this->super_peer_connection_hot_members).field_0x28 & 0xfd;
    }
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (&local_80,torrent_aborted,(type *)0x0);
    local_81 = 0;
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,&local_80,1,0);
    local_88 = 1;
  }
LAB_00452b42:
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_40);
  ::std::shared_ptr<libtorrent::aux::peer_connection>::~shared_ptr
            ((shared_ptr<libtorrent::aux::peer_connection> *)
             &t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void peer_connection::second_tick(int const tick_interval_ms)
	{
		TORRENT_ASSERT(is_single_thread());
		time_point const now = aux::time_now();
		std::shared_ptr<peer_connection> me(self());

		// the invariant check must be run before me is destructed
		// in case the peer got disconnected
		INVARIANT_CHECK;

		auto t = m_torrent.lock();

		std::uint8_t warning = 0;
		// drain the IP overhead from the bandwidth limiters
		if (m_settings.get_bool(settings_pack::rate_limit_ip_overhead) && t)
		{
			warning |= m_ses.use_quota_overhead(*this
				, m_statistics.download_ip_overhead()
				, m_statistics.upload_ip_overhead());
			warning |= m_ses.use_quota_overhead(*t
				, m_statistics.download_ip_overhead()
				, m_statistics.upload_ip_overhead());
		}

		if (warning && t->alerts().should_post<performance_alert>())
		{
			for (int channel = 0; channel < 2; ++channel)
			{
				if (((warning >> channel) & 1u) == 0) continue;
				t->alerts().emplace_alert<performance_alert>(t->get_handle()
					, channel == peer_connection::download_channel
					? performance_alert::download_limit_too_low
					: performance_alert::upload_limit_too_low);
			}
		}

		if (!t || m_disconnecting)
		{
			TORRENT_ASSERT(t || !m_connecting);
			if (m_connecting)
			{
				m_counters.inc_stats_counter(counters::num_peers_half_open, -1);
				if (t) t->dec_num_connecting(m_peer_info);
				m_connecting = false;
			}
			disconnect(errors::torrent_aborted, operation_t::bittorrent);
			return;
		}

		if (m_endgame_mode
			&& m_interesting
			&& m_download_queue.empty()
			&& m_request_queue.empty()
			&& now - seconds(5) >= m_last_request.get(m_connect))
		{
			// this happens when we're in strict end-game
			// mode and the peer could not request any blocks
			// because they were all taken but there were still
			// unrequested blocks. Now, 5 seconds later, there
			// might not be any unrequested blocks anymore, so
			// we should try to pick another block to see
			// if we can pick a busy one
			m_last_request.set(m_connect, now);
			if (request_a_block(*t, *this))
				m_counters.inc_stats_counter(counters::end_game_piece_picks);
			if (m_disconnecting) return;
			send_block_requests();
		}

#ifndef TORRENT_DISABLE_SUPERSEEDING
		if (t->super_seeding()
			&& t->ready_for_connections()
			&& !m_peer_interested
			&& m_became_uninterested.get(m_connect) + seconds(10) < now)
		{
			// maybe we need to try another piece, to see if the peer
			// become interested in us then
			superseed_piece(piece_index_t(-1), t->get_piece_to_super_seed(m_have_piece));
		}
#endif

		on_tick();
		if (is_disconnecting()) return;

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& e : m_extensions)
		{
			e->tick();
		}
		if (is_disconnecting()) return;
#endif

		// if the peer hasn't said a thing for a certain
		// time, it is considered to have timed out
		time_duration d = now - m_last_receive.get(m_connect);

		if (m_connecting)
		{
			int connect_timeout = m_settings.get_int(settings_pack::peer_connect_timeout);
			if (m_peer_info) connect_timeout += 3 * m_peer_info->failcount;

			// SSL and i2p handshakes are slow
			if (is_ssl(m_socket))
				connect_timeout += 10;

#if TORRENT_USE_I2P
			if (is_i2p(m_socket))
				connect_timeout += 20;
#endif

			if (d > seconds(connect_timeout)
				&& can_disconnect(errors::timed_out))
			{
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::info, "CONNECT_FAILED", "waited %d seconds"
					, int(total_seconds(d)));
#endif
				connect_failed(errors::timed_out);
				return;
			}
		}

		// if the bw_network flag isn't set, it means we are not even trying to
		// read from this peer's socket. Most likely because we're applying a
		// rate limit. If the peer is "slow" because we are rate limiting it,
		// don't enforce timeouts. However, as soon as we *do* read from the
		// socket, we expect to receive data, and not have timed out. Then we
		// can enforce the timeouts.
		bool const reading_socket = bool(m_channel_state[download_channel] & peer_info::bw_network);

		// TODO: 2 use a deadline_timer for timeouts. Don't rely on second_tick()!
		// Hook this up to connect timeout as well. This would improve performance
		// because of less work in second_tick(), and might let use remove ticking
		// entirely eventually
		if (reading_socket && d > seconds(timeout()) && !m_connecting && m_reading_bytes == 0
			&& can_disconnect(errors::timed_out_inactivity))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "LAST_ACTIVITY", "%d seconds ago"
				, int(total_seconds(d)));
#endif
			disconnect(errors::timed_out_inactivity, operation_t::bittorrent);
			return;
		}

		// do not stall waiting for a handshake
		int timeout = m_settings.get_int (settings_pack::handshake_timeout);
#if TORRENT_USE_I2P
		timeout *= is_i2p(m_socket) ? 4 : 1;
#endif
		if (reading_socket
			&& !m_connecting
			&& in_handshake()
			&& d > seconds(timeout))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "NO_HANDSHAKE", "waited %d seconds"
				, int(total_seconds(d)));
#endif
			disconnect(errors::timed_out_no_handshake, operation_t::bittorrent);
			return;
		}

		// disconnect peers that we unchoked, but they didn't send a request in
		// the last 60 seconds, and we haven't been working on servicing a request
		// for more than 60 seconds.
		// but only if we're a seed
		d = now - std::max(std::max(m_last_unchoke.get(m_connect)
			, m_last_incoming_request.get(m_connect))
			, m_last_sent_payload.get(m_connect));

		if (reading_socket
			&& !m_connecting
			&& m_requests.empty()
			&& m_reading_bytes == 0
			&& !m_choked
			&& m_peer_interested
			&& t && t->is_upload_only()
			&& d > seconds(60)
			&& can_disconnect(errors::timed_out_no_request))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "NO_REQUEST", "waited %d seconds"
				, int(total_seconds(d)));
#endif
			disconnect(errors::timed_out_no_request, operation_t::bittorrent);
			return;
		}

		// if the peer hasn't become interested and we haven't
		// become interested in the peer for 10 minutes, it
		// has also timed out.
		time_duration const d1 = now - m_became_uninterested.get(m_connect);
		time_duration const d2 = now - m_became_uninteresting.get(m_connect);
		time_duration const time_limit = seconds(
			m_settings.get_int(settings_pack::inactivity_timeout));

		// if we are close enough to the limit, consider the peer connection
		// list full. This will enable the inactive timeout
		bool const max_session_conns = m_ses.num_connections()
			>= m_settings.get_int(settings_pack::connections_limit) - 5;
		bool const max_torrent_conns = t && t->num_peers()
			>= t->max_connections() - 5;

		// don't bother disconnect peers we haven't been interested
		// in (and that hasn't been interested in us) for a while
		// unless we have used up all our connection slots
		if (reading_socket
			&& !m_interesting
			&& !m_peer_interested
			&& d1 > time_limit
			&& d2 > time_limit
			&& (max_session_conns || max_torrent_conns)
			&& can_disconnect(errors::timed_out_no_interest))
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "MUTUAL_NO_INTEREST", "t1: %d t2: %d"
					, int(total_seconds(d1)), int(total_seconds(d2)));
			}
#endif
			disconnect(errors::timed_out_no_interest, operation_t::bittorrent);
			return;
		}

		if (reading_socket
			&& !m_download_queue.empty()
			&& m_quota[download_channel] > 0
			&& now > m_requested.get(m_connect) + seconds(request_timeout()))
		{
			snub_peer();
		}

		// if we haven't sent something in too long, send a keep-alive
		keep_alive();

		// if our download rate isn't increasing significantly anymore, end slow
		// start. The 10kB is to have some slack here.
		// we can't do this when we're choked, because we aren't sending any
		// requests yet, so there hasn't been an opportunity to ramp up the
		// connection yet.
		if (m_slow_start
			&& !m_peer_choked
			&& m_downloaded_last_second > 0
			&& m_downloaded_last_second + 5000
				>= m_statistics.last_payload_downloaded())
		{
			m_slow_start = false;
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "SLOW_START", "exit slow start: "
					"prev-dl: %d dl: %d"
					, int(m_downloaded_last_second)
					, m_statistics.last_payload_downloaded());
			}
#endif
		}
		m_downloaded_last_second = m_statistics.last_payload_downloaded();
		m_uploaded_last_second = m_statistics.last_payload_uploaded();

		m_statistics.second_tick(tick_interval_ms);

		if (m_statistics.upload_payload_rate() > m_upload_rate_peak)
		{
			m_upload_rate_peak = m_statistics.upload_payload_rate();
		}
		if (m_statistics.download_payload_rate() > m_download_rate_peak)
		{
			m_download_rate_peak = m_statistics.download_payload_rate();
		}
		if (is_disconnecting()) return;

		if (!t->ready_for_connections()) return;

		update_desired_queue_size();

		if (m_desired_queue_size == m_max_out_request_queue
			&& t->alerts().should_post<performance_alert>())
		{
			t->alerts().emplace_alert<performance_alert>(t->get_handle()
				, performance_alert::outstanding_request_limit_reached);
		}

		int const piece_timeout = m_settings.get_int(settings_pack::piece_timeout);

		if (!m_download_queue.empty()
			&& m_quota[download_channel] > 0
			&& now - m_last_piece.get(m_connect) > seconds(piece_timeout))
		{
			// this peer isn't sending the pieces we've
			// requested (this has been observed by BitComet)
			// in this case we'll clear our download queue and
			// re-request the blocks.
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "PIECE_REQUEST_TIMED_OUT"
					, "%d time: %d to: %d"
					, int(m_download_queue.size()), int(total_seconds(now - m_last_piece.get(m_connect)))
					, piece_timeout);
			}
#endif

			snub_peer();
		}

		fill_send_buffer();
	}